

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.cxx
# Opt level: O2

bool __thiscall
OpenCLKernels::runKernelUpdateFlickerCounter
          (OpenCLKernels *this,UMat *adjacent_frames_similarity_sum,uint similarity_max,
          UMat *corresponding_frames_similarity_sum,float threshold,UMat *flicker_counter,
          string *error)

{
  bool bVar1;
  char cVar2;
  Kernel *pKVar3;
  float threshold_local;
  uint similarity_max_local;
  Queue local_d0 [8];
  size_t global_size [2];
  size_t local_size [2];
  KernelArg local_a8 [40];
  KernelArg local_80 [40];
  KernelArg local_58 [40];
  
  threshold_local = threshold;
  similarity_max_local = similarity_max;
  bVar1 = isAvailable(this,error);
  if (bVar1) {
    global_size[0] = (size_t)*(int *)(adjacent_frames_similarity_sum + 0xc);
    global_size[1] = (size_t)*(int *)(adjacent_frames_similarity_sum + 8);
    local_size[0] = 0x10;
    local_size[1] = 0x10;
    std::mutex::lock(&this->kernel_update_flicker_counter_guard);
    cv::ocl::KernelArg::ReadOnlyNoSize(local_58,adjacent_frames_similarity_sum,1,1);
    cv::ocl::KernelArg::ReadOnlyNoSize(local_80,corresponding_frames_similarity_sum,1,1);
    cv::ocl::KernelArg::ReadWriteNoSize(local_a8,flicker_counter,1,1);
    pKVar3 = cv::ocl::Kernel::
             args<cv::ocl::KernelArg,unsigned_int,cv::ocl::KernelArg,float,cv::ocl::KernelArg>
                       (&this->kernel_update_flicker_counter,local_58,&similarity_max_local,local_80
                        ,&threshold_local,local_a8);
    cv::ocl::Queue::Queue(local_d0);
    cVar2 = cv::ocl::Kernel::run
                      ((int)pKVar3,(ulong *)0x2,global_size,SUB81(local_size,0),(Queue *)0x1);
    cv::ocl::Queue::~Queue(local_d0);
    pthread_mutex_unlock((pthread_mutex_t *)&this->kernel_update_flicker_counter_guard);
    if (cVar2 == '\0') {
      std::__cxx11::string::assign((char *)error);
    }
  }
  else {
    cVar2 = '\0';
  }
  return (bool)cVar2;
}

Assistant:

bool OpenCLKernels::runKernelUpdateFlickerCounter(const UMat &adjacent_frames_similarity_sum,
                                                  unsigned int similarity_max,
                                                  const UMat &corresponding_frames_similarity_sum, float threshold,
                                                  UMat &flicker_counter, std::string &error)
{
    if(!isAvailable(error)) {
        return false;
    }

    size_t global_size[2] = {(size_t) adjacent_frames_similarity_sum.cols,
                             (size_t) adjacent_frames_similarity_sum.rows};
    size_t local_size[2] = {16, 16};
    bool execution_result;
    {
        scoped_lock<mutex> lock(kernel_update_flicker_counter_guard);
        execution_result = kernel_update_flicker_counter.args(
                        cv::ocl::KernelArg::ReadOnlyNoSize(adjacent_frames_similarity_sum),
                        similarity_max,
                        cv::ocl::KernelArg::ReadOnlyNoSize(corresponding_frames_similarity_sum),
                        threshold,
                        cv::ocl::KernelArg::ReadWriteNoSize(flicker_counter)
                ).run(2, global_size, local_size, true);
    }
    if(!execution_result) {
        error = "OpenCL kernel: kernel_update_flicker_counter launch failed.";
        return false;
    }

    return true;
}